

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O3

void __thiscall
webrtc::NoiseSuppressionImpl::Initialize
          (NoiseSuppressionImpl *this,size_t channels,int sample_rate_hz)

{
  Suppressor *__ptr;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  Suppressor *this_00;
  long lVar4;
  default_delete<webrtc::NoiseSuppressionImpl::Suppressor> *this_01;
  CritScope cs;
  vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  local_58;
  CritScope local_38;
  
  rtc::CritScope::CritScope(&local_38,this->crit_);
  this->channels_ = channels;
  this->sample_rate_hz_ = sample_rate_hz;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->enabled_ == true) {
    std::
    vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
    ::resize(&local_58,channels);
    if (channels != 0) {
      lVar4 = 0;
      do {
        this_01 = (default_delete<webrtc::NoiseSuppressionImpl::Suppressor> *)
                  ((long)&((local_58.
                            super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                          super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                          .super__Head_base<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_false>.
                          _M_head_impl + lVar4);
        this_00 = (Suppressor *)operator_new(8);
        Suppressor::Suppressor(this_00,sample_rate_hz);
        __ptr = *(Suppressor **)this_01;
        *(Suppressor **)this_01 = this_00;
        if (__ptr != (Suppressor *)0x0) {
          std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>::operator()(this_01,__ptr);
        }
        lVar4 = lVar4 + 8;
        channels = channels - 1;
      } while (channels != 0);
    }
  }
  puVar1 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->suppressors_).
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(undefined4 *)
   &(this->suppressors_).
    super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  *(undefined4 *)
   ((long)&(this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  *(undefined4 *)
   &(this->suppressors_).
    super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)
   ((long)&(this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar2;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
  (*(this->super_NoiseSuppression)._vptr_NoiseSuppression[2])(this,(ulong)this->level_);
  std::
  vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ::~vector(&local_58);
  rtc::CritScope::~CritScope(&local_38);
  return;
}

Assistant:

void NoiseSuppressionImpl::Initialize(size_t channels, int sample_rate_hz) {
  rtc::CritScope cs(crit_);
  channels_ = channels;
  sample_rate_hz_ = sample_rate_hz;
  std::vector<std::unique_ptr<Suppressor>> new_suppressors;
  if (enabled_) {
    new_suppressors.resize(channels);
    for (size_t i = 0; i < channels; i++) {
      new_suppressors[i].reset(new Suppressor(sample_rate_hz));
    }
  }
  suppressors_.swap(new_suppressors);
  set_level(level_);
}